

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateSerializeOneField
          (ImmutableMessageGenerator *this,Printer *printer,FieldDescriptor *field)

{
  __uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
  _Var1;
  LogMessage *other;
  long *plVar2;
  LogFinisher local_69;
  LogMessage local_68;
  
  if (*(Descriptor **)(field + 0x20) != (this->field_generators_).descriptor_) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_field.h"
               ,0x8a);
    other = internal::LogMessage::operator<<
                      (&local_68,"CHECK failed: (field->containing_type()) == (descriptor_): ");
    internal::LogFinisher::operator=(&local_69,other);
    internal::LogMessage::~LogMessage(&local_68);
  }
  if (((byte)field[1] & 8) == 0) {
    plVar2 = (long *)(*(long *)(field + 0x20) + 0x28);
  }
  else if (*(long *)(field + 0x28) == 0) {
    plVar2 = (long *)(*(long *)(field + 0x10) + 0x70);
  }
  else {
    plVar2 = (long *)(*(long *)(field + 0x28) + 0x50);
  }
  _Var1._M_t.
  super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
  .super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>.
  _M_head_impl = (this->field_generators_).field_generators_.
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start
                 [(int)((ulong)((long)field - *plVar2) >> 3) * 0x38e38e39]._M_t.
                 super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                 ._M_t;
  (**(code **)(*(long *)_Var1._M_t.
                        super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                        .
                        super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                        ._M_head_impl + 0x70))
            (_Var1._M_t.
             super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
             .
             super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
             ._M_head_impl,printer);
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateSerializeOneField(
    io::Printer* printer, const FieldDescriptor* field) {
  field_generators_.get(field).GenerateSerializationCode(printer);
}